

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprPopulatePoslistsCb
              (void *pCtx,int tflags,char *pToken,int nToken,int iUnused1,int iUnused2)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  int rc;
  int nTerm;
  Fts5ExprTerm *pTerm;
  int i;
  Fts5Expr *pExpr;
  Fts5ExprCtx *p;
  int iUnused2_local;
  int iUnused1_local;
  int nToken_local;
  char *pToken_local;
  int tflags_local;
  void *pCtx_local;
  
  lVar1 = *pCtx;
  iUnused2_local = nToken;
  if (0x8000 < nToken) {
    iUnused2_local = 0x8000;
  }
  if ((tflags & 1U) == 0) {
    *(long *)((long)pCtx + 0x10) = *(long *)((long)pCtx + 0x10) + 1;
  }
  pTerm._4_4_ = 0;
  do {
    if (*(int *)(lVar1 + 0x1c) <= pTerm._4_4_) {
      return 0;
    }
    if (*(int *)(*(long *)((long)pCtx + 8) + (long)pTerm._4_4_ * 0x10 + 8) != 0) {
      for (_rc = (char *)(*(long *)(*(long *)(lVar1 + 0x20) + (long)pTerm._4_4_ * 8) + 0x20);
          _rc != (char *)0x0; _rc = *(char **)(_rc + 0x18)) {
        sVar3 = strlen(*(char **)(_rc + 8));
        iVar2 = (int)sVar3;
        if (((iVar2 == iUnused2_local) || ((iVar2 < iUnused2_local && (*_rc != '\0')))) &&
           (iVar2 = memcmp(*(void **)(_rc + 8),pToken,(long)iVar2), iVar2 == 0)) {
          iVar2 = sqlite3Fts5PoslistWriterAppend
                            ((Fts5Buffer *)
                             (*(long *)(*(long *)(lVar1 + 0x20) + (long)pTerm._4_4_ * 8) + 8),
                             (Fts5PoslistWriter *)
                             (*(long *)((long)pCtx + 8) + (long)pTerm._4_4_ * 0x10),
                             *(i64 *)((long)pCtx + 0x10));
          if (iVar2 != 0) {
            return iVar2;
          }
          break;
        }
      }
    }
    pTerm._4_4_ = pTerm._4_4_ + 1;
  } while( true );
}

Assistant:

static int fts5ExprPopulatePoslistsCb(
  void *pCtx,                /* Copy of 2nd argument to xTokenize() */
  int tflags,                /* Mask of FTS5_TOKEN_* flags */
  const char *pToken,        /* Pointer to buffer containing token */
  int nToken,                /* Size of token in bytes */
  int iUnused1,              /* Byte offset of token within input text */
  int iUnused2               /* Byte offset of end of token within input text */
){
  Fts5ExprCtx *p = (Fts5ExprCtx*)pCtx;
  Fts5Expr *pExpr = p->pExpr;
  int i;

  UNUSED_PARAM2(iUnused1, iUnused2);

  if( nToken>FTS5_MAX_TOKEN_SIZE ) nToken = FTS5_MAX_TOKEN_SIZE;
  if( (tflags & FTS5_TOKEN_COLOCATED)==0 ) p->iOff++;
  for(i=0; i<pExpr->nPhrase; i++){
    Fts5ExprTerm *pTerm;
    if( p->aPopulator[i].bOk==0 ) continue;
    for(pTerm=&pExpr->apExprPhrase[i]->aTerm[0]; pTerm; pTerm=pTerm->pSynonym){
      int nTerm = (int)strlen(pTerm->zTerm);
      if( (nTerm==nToken || (nTerm<nToken && pTerm->bPrefix))
       && memcmp(pTerm->zTerm, pToken, nTerm)==0
      ){
        int rc = sqlite3Fts5PoslistWriterAppend(
            &pExpr->apExprPhrase[i]->poslist, &p->aPopulator[i].writer, p->iOff
        );
        if( rc ) return rc;
        break;
      }
    }
  }
  return SQLITE_OK;
}